

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O3

N_Vector N_VCloneEmpty_Serial(N_Vector w)

{
  int iVar1;
  N_Vector v;
  undefined4 *puVar2;
  
  if ((w != (N_Vector)0x0) && (v = N_VNewEmpty(w->sunctx), v != (N_Vector)0x0)) {
    iVar1 = N_VCopyOps(w,v);
    if ((iVar1 == 0) && (puVar2 = (undefined4 *)malloc(0x10), puVar2 != (undefined4 *)0x0)) {
      v->content = puVar2;
      *puVar2 = *w->content;
      puVar2[1] = 0;
      *(undefined8 *)(puVar2 + 2) = 0;
      return v;
    }
    N_VDestroy(v);
  }
  return (N_Vector)0x0;
}

Assistant:

N_Vector N_VCloneEmpty_Serial(N_Vector w)
{
  N_Vector v;
  N_VectorContent_Serial content;

  if (w == NULL) return(NULL);

  /* Create vector */
  v = NULL;
  v = N_VNewEmpty(w->sunctx);
  if (v == NULL) return(NULL);

  /* Attach operations */
  if (N_VCopyOps(w, v)) { N_VDestroy(v); return(NULL); }

  /* Create content */
  content = NULL;
  content = (N_VectorContent_Serial) malloc(sizeof *content);
  if (content == NULL) { N_VDestroy(v); return(NULL); }

  /* Attach content */
  v->content = content;

  /* Initialize content */
  content->length   = NV_LENGTH_S(w);
  content->own_data = SUNFALSE;
  content->data     = NULL;

  return(v);
}